

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::detail::SerializeAttribute<tinyusdz::value::color3f>
               (string *attr_name,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *attr,
               string *value_str,string *err)

{
  ostream *poVar1;
  storage_t<tinyusdz::Animatable<tinyusdz::value::color3f>_> *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar3;
  color3f value;
  ostringstream ss_e;
  stringstream value_ss;
  undefined1 local_370 [12];
  undefined4 uStack_364;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  string local_350;
  string local_330 [3];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start) || ((attr->_empty & 1U) == 0)) {
    if (attr->_blocked == true) {
      ::std::__cxx11::string::_M_replace
                ((ulong)value_str,0,(char *)value_str->_M_string_length,0x41f4cd);
LAB_002e6ae8:
      bVar3 = true;
      goto LAB_002e6aea;
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(attr->_attrib).contained;
    psVar2 = (storage_t<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)&attr->_fallback;
    if ((attr->_attrib).has_value_ != false) {
      psVar2 = (storage_t<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)args;
    }
    if (*(bool *)((long)psVar2 + 0xc) != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"Failed to get the value of `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_370,(fmt *)&local_350,(string *)attr_name,args);
      poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_330,(char *)local_370._0_8_,
                          CONCAT44(uStack_364,local_370._8_4_));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._0_8_ != &local_360) {
        operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) goto LAB_002e6a5b;
      goto LAB_002e6a68;
    }
    bVar3 = *(bool *)((long)psVar2 + 0xd);
    if (bVar3 == false) {
      local_370._8_4_ = *(float *)((long)psVar2 + 8);
      local_370._0_8_ = *(undefined8 *)psVar2;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
      to_xml_string<tinyusdz::value::color3f>(local_330,(color3f *)local_370);
      poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
        operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1b3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"Failed to get the value at default time of `{}`","");
      fmt::format<std::__cxx11::string>
                ((string *)local_370,(fmt *)&local_350,(string *)attr_name,args);
      poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_330,(char *)local_370._0_8_,
                          CONCAT44(uStack_364,local_370._8_4_));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._0_8_ != &local_360) {
        operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_370._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._0_8_ != &local_360) {
          operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      ::std::ios_base::~ios_base(local_2c0);
    }
    if (bVar3 == false) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)value_str,(string *)local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
        operator_delete(local_330[0]._M_dataplus._M_p,local_330[0].field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_002e6ae8;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"SerializeAttribute",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
    poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1a6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_350,"TODO: connection attribute","");
    fmt::format((string *)local_370,&local_350);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_330,(char *)local_370._0_8_,
                        CONCAT44(uStack_364,local_370._8_4_));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._0_8_ != &local_360) {
      operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
LAB_002e6a5b:
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
LAB_002e6a68:
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_370._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._0_8_ != &local_360) {
        operator_delete((void *)local_370._0_8_,local_360._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
    ::std::ios_base::~ios_base(local_2c0);
  }
  bVar3 = false;
LAB_002e6aea:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar3;
}

Assistant:

bool SerializeAttribute(const std::string &attr_name,
                        const TypedAttributeWithFallback<Animatable<T>> &attr,
                        std::string &value_str, std::string *err) {
  std::stringstream value_ss;

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: connection attribute"));
  } else if (attr.is_blocked()) {
    // do nothing
    value_str = "";
    return true;
  } else {
    const Animatable<T> &animatable_value = attr.get_value();
    if (animatable_value.has_default()) {
      T value;
      if (animatable_value.get_scalar(&value)) {
        value_ss << "\"" << to_xml_string(value) << "\"";
      } else {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Failed to get the value at default time of `{}`", attr_name));
      }
    } else { 
      // no time-varying(timesamples) attribute in MaterialX.
      
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to get the value of `{}`", attr_name));
    }
  }

  value_str = value_ss.str();
  return true;
}